

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O2

int __thiscall
cplus::socket::SocketServer::accept
          (SocketServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  sockaddr_in addr;
  int socket;
  AcceptFailedException *this_00;
  undefined4 in_register_00000034;
  socklen_t length;
  sockaddr_in client_addr;
  socklen_t local_2c;
  undefined1 local_28 [8];
  uchar auStack_20 [8];
  
  local_28._0_2_ = 0;
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  auStack_20[0] = '\0';
  auStack_20[1] = '\0';
  auStack_20[2] = '\0';
  auStack_20[3] = '\0';
  auStack_20[4] = '\0';
  auStack_20[5] = '\0';
  auStack_20[6] = '\0';
  auStack_20[7] = '\0';
  local_2c = 0x10;
  socket = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 0x18),(sockaddr *)local_28,
                    &local_2c);
  if (-1 < socket) {
    addr.sin_zero[0] = auStack_20[0];
    addr.sin_zero[1] = auStack_20[1];
    addr.sin_zero[2] = auStack_20[2];
    addr.sin_zero[3] = auStack_20[3];
    addr.sin_zero[4] = auStack_20[4];
    addr.sin_zero[5] = auStack_20[5];
    addr.sin_zero[6] = auStack_20[6];
    addr.sin_zero[7] = auStack_20[7];
    addr.sin_family = local_28._0_2_;
    addr.sin_port = local_28._2_2_;
    addr.sin_addr.s_addr = local_28._4_4_;
    Socket::Socket((Socket *)this,socket,addr,
                   *(sockaddr_in *)(CONCAT44(in_register_00000034,__fd) + 8));
    return (int)this;
  }
  this_00 = (AcceptFailedException *)__cxa_allocate_exception(0x838);
  memset(this_00,0,0x838);
  AcceptFailedException::AcceptFailedException(this_00);
  __cxa_throw(this_00,&AcceptFailedException::typeinfo,system::Exception::~Exception);
}

Assistant:

Socket SocketServer::accept() {
			//定义客户端的socket地址结构client_addr
			sockaddr_in client_addr{};
			socklen_t length = sizeof(client_addr);
			
			//接受一个到server_socket代表的socket的一个连接
			//如果没有连接请求,就等待到有连接请求--这是accept函数的特性
			//accept函数返回一个新的socket,这个socket(new_server_socket)用于同连接到的客户的通信
			//new_server_socket代表了服务器和客户端之间的一个通信通道
			//accept函数把连接到的客户端信息填写到客户端的socket地址结构client_addr中
			int new_server_socket = ::accept(server_socket, (struct sockaddr *) &client_addr, &length);
			if (new_server_socket < 0) {
				throw AcceptFailedException();
			}
			
			return {new_server_socket, client_addr, server_addr};
		}